

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O2

qint64 __thiscall QUdpSocket::writeDatagram(QUdpSocket *this,QNetworkDatagram *datagram)

{
  QAbstractSocketPrivate *this_00;
  QNetworkDatagramPrivate *pQVar1;
  bool bVar2;
  SocketState SVar3;
  SocketError errorCode;
  long lVar4;
  qintptr qVar5;
  socklen_t __len;
  QHostAddress *pQVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  QHostAddress local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QAbstractSocket).field_0x8;
  QHostAddress::QHostAddress((QHostAddress *)&QStack_58,Any);
  QNetworkDatagram::destinationAddress((QNetworkDatagram *)&local_40);
  pQVar6 = &local_40;
  bVar2 = QUdpSocketPrivate::doEnsureInitialized
                    ((QUdpSocketPrivate *)this_00,(QHostAddress *)&QStack_58,0,&local_40);
  __len = (socklen_t)pQVar6;
  QHostAddress::~QHostAddress(&local_40);
  QHostAddress::~QHostAddress((QHostAddress *)&QStack_58);
  if (bVar2) {
    SVar3 = QAbstractSocket::state(&this->super_QAbstractSocket);
    if (SVar3 == UnconnectedState) {
      QAbstractSocket::bind(&this->super_QAbstractSocket,0,(sockaddr *)0x0,__len);
    }
    pQVar1 = datagram->d;
    pcVar7 = (pQVar1->data).d.ptr;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    lVar4 = (**(code **)(*(long *)this_00->socketEngine + 0x100))
                      (this_00->socketEngine,pcVar7,(pQVar1->data).d.size,&pQVar1->header);
    qVar5 = (**(code **)(*(long *)this_00->socketEngine + 0x70))();
    this_00->cachedSocketDescriptor = qVar5;
    if (lVar4 < 0) {
      errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString
                ((QString *)&QStack_58,(QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,(QString *)&QStack_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
    }
    else {
      QIODevice::bytesWritten((longlong)this);
    }
  }
  else {
    lVar4 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar4;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUdpSocket::writeDatagram(const QNetworkDatagram &datagram)
{
    Q_D(QUdpSocket);
#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::writeDatagram(%p, %i, \"%s\", %i)",
           datagram.d->data.constData(),
           datagram.d->data.size(),
           datagram.destinationAddress().toString().toLatin1().constData(),
           datagram.destinationPort());
#endif
    if (!d->doEnsureInitialized(QHostAddress::Any, 0, datagram.destinationAddress()))
        return -1;
    if (state() == UnconnectedState)
        bind();

    qint64 sent = d->socketEngine->writeDatagram(datagram.d->data.constData(),
                                                 datagram.d->data.size(),
                                                 datagram.d->header);
    d->cachedSocketDescriptor = d->socketEngine->socketDescriptor();

    if (sent >= 0) {
        emit bytesWritten(sent);
    } else {
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return sent;
}